

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

optional<LockPoints> *
CalculateLockPointsAtTip
          (optional<LockPoints> *__return_storage_ptr__,CBlockIndex *tip,CCoinsView *coins_view,
          CTransaction *tx)

{
  int iVar1;
  CBlockIndex *pCVar2;
  int iVar3;
  unsigned_long uVar4;
  int iVar5;
  uint uVar6;
  pointer piVar7;
  CBlockIndex **ppCVar8;
  pointer pCVar9;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  pair<int,_long> pVar10;
  unsigned_long local_140;
  vector<int,_std::allocator<int>_> local_138;
  vector<int,_std::allocator<int>_> local_118;
  byte local_100;
  CBlockIndex next_tip;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (tip == (CBlockIndex *)0x0) {
    __assert_fail("tip",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0xc9,
                  "std::optional<LockPoints> CalculateLockPointsAtTip(CBlockIndex *, const CCoinsView &, const CTransaction &)"
                 );
  }
  local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize
            (&local_138,
             ((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5);
  local_140 = 0;
  pCVar9 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish != pCVar9) {
    do {
      uVar4 = local_140;
      CTxOut::CTxOut((CTxOut *)&next_tip);
      next_tip.nChainWork.super_base_uint<256U>.pn._0_8_ =
           next_tip.nChainWork.super_base_uint<256U>.pn._0_8_ & 0xffffffff00000000;
      iVar5 = (**coins_view->_vptr_CCoinsView)(coins_view,pCVar9 + uVar4,&next_tip);
      if ((char)iVar5 == '\0') {
        base_blob<256u>::GetHex_abi_cxx11_((string *)local_58,&tx->hash);
        logging_function._M_str = "CalculatePrevHeights";
        logging_function._M_len = 0x14;
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
        ;
        source_file._M_len = 0x5e;
        LogPrintFormatInternal<char[21],unsigned_long,std::__cxx11::string>
                  (logging_function,source_file,0xb6,ALL,Info,(ConstevalFormatString<3U>)0x810cdb,
                   (char (*) [21])"CalculatePrevHeights",&local_140,(string *)local_58);
        if ((CBlockIndex *)local_58._0_8_ != (CBlockIndex *)(local_58 + 0x10)) {
          operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
        }
      }
      else {
        uVar6 = next_tip.nChainWork.super_base_uint<256U>.pn[0] >> 1;
        if (uVar6 == 0x7fffffff) {
          uVar6 = tip->nHeight + 1;
        }
        local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[local_140] = uVar6;
      }
      if (0x1c < next_tip.nUndoPos) {
        free(next_tip.pprev);
      }
      if ((char)iVar5 == '\0') {
        if (local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (int *)0x0) {
          operator_delete(local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        (__return_storage_ptr__->super__Optional_base<LockPoints,_true,_true>)._M_payload.
        super__Optional_payload_base<LockPoints>._M_engaged = false;
        goto LAB_003ea05a;
      }
      local_140 = local_140 + 1;
      pCVar9 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (local_140 <
             (ulong)(((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pCVar9 >> 3) *
                    0x4ec4ec4ec4ec4ec5));
  }
  local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
  local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_100 = 1;
  next_tip.phashBlock = (uint256 *)0x0;
  next_tip.nChainWork.super_base_uint<256U>.pn[6] = 0;
  next_tip.nChainWork.super_base_uint<256U>.pn[7] = 0;
  next_tip.nTx = 0;
  next_tip.nChainWork.super_base_uint<256U>.pn[2] = 0;
  next_tip.nChainWork.super_base_uint<256U>.pn[3] = 0;
  next_tip.nChainWork.super_base_uint<256U>.pn[4] = 0;
  next_tip.nChainWork.super_base_uint<256U>.pn[5] = 0;
  next_tip.nDataPos = 0;
  next_tip.nUndoPos = 0;
  next_tip.nChainWork.super_base_uint<256U>.pn[0] = 0;
  next_tip.nChainWork.super_base_uint<256U>.pn[1] = 0;
  next_tip.pskip = (CBlockIndex *)0x0;
  next_tip.m_chain_tx_count = 0;
  next_tip.nStatus = 0;
  next_tip.nVersion = 0;
  next_tip.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  next_tip.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  next_tip.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  next_tip.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  next_tip.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  next_tip.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  next_tip.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  next_tip.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  next_tip.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  next_tip.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  next_tip.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  next_tip.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  next_tip.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  next_tip.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  next_tip.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  next_tip.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  next_tip.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  next_tip.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  next_tip.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  next_tip.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  next_tip.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  next_tip.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  next_tip.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  next_tip.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  next_tip.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  next_tip.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  next_tip.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  next_tip.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  next_tip.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  next_tip.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  next_tip.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  next_tip.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  next_tip.nTime = 0;
  next_tip.nBits = 0;
  next_tip.nNonce = 0;
  next_tip.nSequenceId = 0;
  next_tip.nTimeMax = 0;
  next_tip.nFile = 0;
  next_tip.nHeight = tip->nHeight + 1;
  next_tip.pprev = tip;
  pVar10 = CalculateSequenceLocks(tx,1,&local_118,&next_tip);
  if (local_100 == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    if (local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      iVar5 = 0;
    }
    else {
      iVar5 = 0;
      piVar7 = local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        iVar1 = *piVar7;
        iVar3 = iVar1;
        if (iVar1 < iVar5) {
          iVar3 = iVar5;
        }
        if (iVar1 == next_tip.nHeight) {
          iVar3 = iVar5;
        }
        iVar5 = iVar3;
        piVar7 = piVar7 + 1;
      } while (piVar7 != local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    }
    local_58._0_8_ = CBlockIndex::GetAncestor(tip,iVar5);
    ppCVar8 = inline_assertion_check<true,CBlockIndex*>
                        ((CBlockIndex **)local_58,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                         ,0xee,"CalculateLockPointsAtTip","tip->GetAncestor(max_input_height)");
    pCVar2 = *ppCVar8;
    (__return_storage_ptr__->super__Optional_base<LockPoints,_true,_true>)._M_payload.
    super__Optional_payload_base<LockPoints>._M_payload._M_value.height = pVar10.first;
    (__return_storage_ptr__->super__Optional_base<LockPoints,_true,_true>)._M_payload.
    super__Optional_payload_base<LockPoints>._M_payload._M_value.time = pVar10.second;
    (__return_storage_ptr__->super__Optional_base<LockPoints,_true,_true>)._M_payload.
    super__Optional_payload_base<LockPoints>._M_payload._M_value.maxInputBlock = pCVar2;
    (__return_storage_ptr__->super__Optional_base<LockPoints,_true,_true>)._M_payload.
    super__Optional_payload_base<LockPoints>._M_engaged = true;
    if (((local_100 & 1) != 0) &&
       (local_100 = 0,
       local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start != (int *)0x0)) {
      operator_delete(local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
LAB_003ea05a:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

std::optional<LockPoints> CalculateLockPointsAtTip(
    CBlockIndex* tip,
    const CCoinsView& coins_view,
    const CTransaction& tx)
{
    assert(tip);

    auto prev_heights{CalculatePrevHeights(*tip, coins_view, tx)};
    if (!prev_heights.has_value()) return std::nullopt;

    CBlockIndex next_tip;
    next_tip.pprev = tip;
    // When SequenceLocks() is called within ConnectBlock(), the height
    // of the block *being* evaluated is what is used.
    // Thus if we want to know if a transaction can be part of the
    // *next* block, we need to use one more than active_chainstate.m_chain.Height()
    next_tip.nHeight = tip->nHeight + 1;
    const auto [min_height, min_time] = CalculateSequenceLocks(tx, STANDARD_LOCKTIME_VERIFY_FLAGS, prev_heights.value(), next_tip);

    // Also store the hash of the block with the highest height of
    // all the blocks which have sequence locked prevouts.
    // This hash needs to still be on the chain
    // for these LockPoint calculations to be valid
    // Note: It is impossible to correctly calculate a maxInputBlock
    // if any of the sequence locked inputs depend on unconfirmed txs,
    // except in the special case where the relative lock time/height
    // is 0, which is equivalent to no sequence lock. Since we assume
    // input height of tip+1 for mempool txs and test the resulting
    // min_height and min_time from CalculateSequenceLocks against tip+1.
    int max_input_height{0};
    for (const int height : prev_heights.value()) {
        // Can ignore mempool inputs since we'll fail if they had non-zero locks
        if (height != next_tip.nHeight) {
            max_input_height = std::max(max_input_height, height);
        }
    }

    // tip->GetAncestor(max_input_height) should never return a nullptr
    // because max_input_height is always less than the tip height.
    // It would, however, be a bad bug to continue execution, since a
    // LockPoints object with the maxInputBlock member set to nullptr
    // signifies no relative lock time.
    return LockPoints{min_height, min_time, Assert(tip->GetAncestor(max_input_height))};
}